

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::TimingControlStatementSyntax::setChild
          (TimingControlStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child);
  (*(code *)(&DAT_0048f0a0 + *(int *)(&DAT_0048f0a0 + index * 4)))();
  return;
}

Assistant:

void TimingControlStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: timingControl = child.node() ? &child.node()->as<TimingControlSyntax>() : nullptr; return;
        case 3: statement = child.node() ? &child.node()->as<StatementSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}